

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O2

void TestStringToDoubleFloatWhitespace(void)

{
  double dVar1;
  bool *pbVar2;
  int *value_source;
  int *processed_characters_count;
  float fVar3;
  bool all_used;
  int processed;
  char kWhitespaceAscii [23];
  uc16 kWhitespace16 [76];
  
  builtin_strncpy(kWhitespaceAscii,"\n\r\t\v\f -\n\r\t\v\f 1.2\n\r\t\v\f ",0x17);
  processed_characters_count = &processed;
  pbVar2 = &all_used;
  dVar1 = StrToD(kWhitespaceAscii,0x38,NAN,processed_characters_count,&all_used,0);
  CheckEqualsHelper((char *)0x15e1,0xc12e9e,
                    "StrToD(kWhitespaceAscii, flags, Double::NaN(), &processed, &all_used)",-1.2,
                    pbVar2,dVar1);
  CheckHelper((char *)0x15e2,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = &all_used;
  dVar1 = StrToF(kWhitespaceAscii,0x38,NAN,processed_characters_count,&all_used);
  CheckEqualsHelper((char *)0x15e4,0xc196de,
                    "StrToF(kWhitespaceAscii, flags, Double::NaN(), &processed, &all_used)",
                    -1.2000000476837158,pbVar2,dVar1);
  CheckHelper((char *)0x15e5,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  memcpy(kWhitespace16,&DAT_00c19a10,0x98);
  value_source = processed_characters_count;
  dVar1 = StrToD16(kWhitespace16,0x4c,0x38,NAN,processed_characters_count,&all_used,0);
  CheckEqualsHelper((char *)0x160e,0xc12e9e,
                    "StrToD16(kWhitespace16, kWhitespace16Length, flags, Double::NaN(), &processed, &all_used)"
                    ,-1.2,(char *)value_source,dVar1);
  CheckHelper((char *)0x160f,0xc13064,(char *)(ulong)all_used,SUB81(value_source,0));
  fVar3 = StrToF16(kWhitespace16,0x4c,0x38,NAN,processed_characters_count,&all_used);
  CheckEqualsHelper((char *)0x1612,0xc196de,
                    "StrToF16(kWhitespace16, kWhitespace16Length, flags, Single::NaN(), &processed, &all_used)"
                    ,-1.2000000476837158,(char *)processed_characters_count,(double)fVar3);
  CheckHelper((char *)0x1613,0xc13064,(char *)(ulong)all_used,SUB81(processed_characters_count,0));
  return;
}

Assistant:

TEST(StringToDoubleFloatWhitespace) {
  int flags;
  int processed;
  bool all_used;

  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN;

  const char kWhitespaceAscii[] = {
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20,
    '-',
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20,
    '1', '.', '2',
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20,
    0x00
  };
  CHECK_EQ(-1.2, StrToD(kWhitespaceAscii, flags, Double::NaN(),
                        &processed, &all_used));
  CHECK(all_used);
  CHECK_EQ(-1.2f, StrToF(kWhitespaceAscii, flags, Double::NaN(),
                         &processed, &all_used));
  CHECK(all_used);

  const uc16 kOghamSpaceMark = 0x1680;
  const uc16 kMongolianVowelSeparator = 0x180E;
  const uc16 kEnQuad = 0x2000;
  const uc16 kEmQuad = 0x2001;
  const uc16 kEnSpace = 0x2002;
  const uc16 kEmSpace = 0x2003;
  const uc16 kThreePerEmSpace = 0x2004;
  const uc16 kFourPerEmSpace = 0x2005;
  const uc16 kSixPerEmSpace = 0x2006;
  const uc16 kFigureSpace = 0x2007;
  const uc16 kPunctuationSpace = 0x2008;
  const uc16 kThinSpace = 0x2009;
  const uc16 kHairSpace = 0x200A;
  const uc16 kNarrowNoBreakSpace = 0x202F;
  const uc16 kMediumMathematicalSpace = 0x205F;
  const uc16 kIdeographicSpace = 0x3000;

  const uc16 kWhitespace16[] = {
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20, 0xA0, 0xFEFF,
    kOghamSpaceMark, kMongolianVowelSeparator, kEnQuad, kEmQuad,
    kEnSpace, kEmSpace, kThreePerEmSpace, kFourPerEmSpace, kSixPerEmSpace,
    kFigureSpace, kPunctuationSpace, kThinSpace, kHairSpace,
    kNarrowNoBreakSpace, kMediumMathematicalSpace, kIdeographicSpace,
    '-',
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20, 0xA0, 0xFEFF,
    kOghamSpaceMark, kMongolianVowelSeparator, kEnQuad, kEmQuad,
    kEnSpace, kEmSpace, kThreePerEmSpace, kFourPerEmSpace, kSixPerEmSpace,
    kFigureSpace, kPunctuationSpace, kThinSpace, kHairSpace,
    kNarrowNoBreakSpace, kMediumMathematicalSpace, kIdeographicSpace,
    '1', '.', '2',
    0x0A, 0x0D, 0x09, 0x0B, 0x0C, 0x20, 0xA0, 0xFEFF,
    kOghamSpaceMark, kMongolianVowelSeparator, kEnQuad, kEmQuad,
    kEnSpace, kEmSpace, kThreePerEmSpace, kFourPerEmSpace, kSixPerEmSpace,
    kFigureSpace, kPunctuationSpace, kThinSpace, kHairSpace,
    kNarrowNoBreakSpace, kMediumMathematicalSpace, kIdeographicSpace,
  };
  const int kWhitespace16Length = DOUBLE_CONVERSION_ARRAY_SIZE(kWhitespace16);
  CHECK_EQ(-1.2, StrToD16(kWhitespace16, kWhitespace16Length, flags,
                          Double::NaN(),
                          &processed, &all_used));
  CHECK(all_used);
  CHECK_EQ(-1.2f, StrToF16(kWhitespace16, kWhitespace16Length, flags,
                           Single::NaN(),
                           &processed, &all_used));
  CHECK(all_used);
}